

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_task.cpp
# Opt level: O3

void __thiscall
duckdb::ExecutorTask::ExecutorTask
          (ExecutorTask *this,ClientContext *context_p,shared_ptr<duckdb::Event,_true> *event_p,
          PhysicalOperator *op_p)

{
  atomic<unsigned_long> *paVar1;
  _Head_base<0UL,_duckdb::ThreadContext_*,_false> this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Executor *pEVar4;
  _Head_base<0UL,_duckdb::ThreadContext_*,_false> this_01;
  
  (this->super_Task).super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
  super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Task).super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
  super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Task).token.ptr = (ProducerToken *)0x0;
  (this->super_Task)._vptr_Task = (_func_int **)&PTR__ExecutorTask_0244a8d8;
  pEVar4 = ClientContext::GetExecutor(context_p);
  this->executor = pEVar4;
  (this->event).internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->event).internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->event).internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->thread_context).
  super_unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super___uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
  super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl = (ThreadContext *)0x0;
  (this->op).ptr = op_p;
  this->context = context_p;
  this_01._M_head_impl = (ThreadContext *)operator_new(0xa8);
  ThreadContext::ThreadContext(this_01._M_head_impl,context_p);
  this_00._M_head_impl =
       (this->thread_context).
       super_unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
       super___uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
       super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl;
  (this->thread_context).
  super_unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super___uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
  super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl = this_01._M_head_impl;
  if (this_00._M_head_impl != (ThreadContext *)0x0) {
    ThreadContext::~ThreadContext(this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  LOCK();
  paVar1 = &this->executor->executor_tasks;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

ExecutorTask::ExecutorTask(ClientContext &context_p, shared_ptr<Event> event_p, const PhysicalOperator &op_p)
    : executor(Executor::Get(context_p)), event(std::move(event_p)), op(&op_p), context(context_p) {
	thread_context = make_uniq<ThreadContext>(context_p);
	executor.RegisterTask();
}